

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_2,_0>::calcStatesStates
          (BeagleCPUSSEImpl<double,_2,_0> *this,double *destP,int *states_q,double *matrices_q,
          int *states_r,double *matrices_r,int startPattern,int endPattern)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  
  iVar1 = (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount;
  uVar2 = (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
  iVar3 = (this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount;
  for (uVar12 = 0; uVar12 != (~((int)uVar2 >> 0x1f) & uVar2); uVar12 = uVar12 + 1) {
    iVar4 = (this->super_BeagleCPUImpl<double,_2,_0>).kMatrixSize;
    uVar5 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount;
    iVar13 = (iVar1 * uVar12 + startPattern) * iVar3;
    for (lVar15 = (long)startPattern; lVar15 < endPattern; lVar15 = lVar15 + 1) {
      iVar6 = states_q[lVar15];
      iVar7 = states_r[lVar15];
      iVar8 = (this->super_BeagleCPUImpl<double,_2,_0>).kTransPaddedStateCount;
      lVar14 = (long)(int)(iVar4 * uVar12);
      for (lVar11 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != (uint)lVar11; lVar11 = lVar11 + 1) {
        lVar9 = iVar6 + lVar14;
        lVar10 = iVar7 + lVar14;
        lVar14 = lVar14 + iVar8;
        destP[iVar13 + lVar11] = matrices_q[lVar9] * matrices_r[lVar10];
      }
      iVar13 = iVar13 + (uint)lVar11;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcStatesStates(double* destP,
                                                               const int* states_q,
                                                               const double* matrices_q,
                                                               const int* states_r,
                                                               const double* matrices_r,
                                                               int startPattern,
                                                               int endPattern) {

	BeagleCPUImpl<BEAGLE_CPU_SSE_DOUBLE>::calcStatesStates(destP,
                                                           states_q,
                                                           matrices_q,
                                                           states_r,
                                                           matrices_r,
                                                           startPattern,
                                                           endPattern);
}